

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

pair<BigInt,_long_long> * __thiscall
BigInt::divModValue(pair<BigInt,_long_long> *__return_storage_ptr__,BigInt *this,longlong val)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  BigInt result;
  string num;
  BigInt local_80;
  BigInt local_60;
  string local_40;
  
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_80.vector_value,&this->vector_value);
  local_80.sign = this->sign;
  to_string_abi_cxx11_(&local_40,&local_80);
  if (local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_80.vector_value,&this->vector_value);
  local_80.sign = this->sign;
  uVar2 = (int)((ulong)((long)local_80.vector_value.
                              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_80.vector_value.
                             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) - 1;
  if ((int)uVar2 < 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    lVar4 = (ulong)uVar2 + 1;
    do {
      lVar5 = lVar3 * base +
              local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar4 + -1];
      lVar3 = lVar5 % val;
      local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4 + -1] = lVar5 / val;
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  trim(&local_60,&local_80);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)__return_storage_ptr__,
             &local_60.vector_value);
  (__return_storage_ptr__->first).sign = local_60.sign;
  __return_storage_ptr__->second = lVar3;
  if (local_60.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

pair<BigInt, long long> divModValue(long long val) const { //! divide by val
        auto num = BigInt(*this).to_string();

        BigInt result((*this));
        long long remainder = 0;
        long long temp;
        for (auto i = static_cast<int>(result.vector_value.size() - 1); i >= 0; i--) {
            temp = (result.vector_value[i] + remainder * base);
            remainder = temp % val;
            result.vector_value[i] = temp / val;
        }
        pair<BigInt, long long> ret (result.trim(), remainder);
        return ret;
    }